

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void PathBezierQuadraticCurveToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float tess_tol,int level)

{
  float y3_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 *__dest;
  int iVar5;
  int iVar6;
  int iVar7;
  
  fVar1 = x3 - x1;
  fVar2 = y3 - y1;
  fVar3 = (x2 - x3) * fVar2 - fVar1 * (y2 - y3);
  if ((fVar1 * fVar1 + fVar2 * fVar2) * tess_tol <= fVar3 * fVar3 * 4.0) {
    iVar7 = 10;
    if (10 < level) {
      iVar7 = level;
    }
    iVar6 = level + 1;
    do {
      if (iVar6 - iVar7 == 1) {
        return;
      }
      fVar1 = (x2 + x1) * 0.5;
      fVar2 = (y1 + y2) * 0.5;
      x2 = (x2 + x3) * 0.5;
      y2 = (y2 + y3) * 0.5;
      fVar3 = (fVar1 + x2) * 0.5;
      y3_00 = (fVar2 + y2) * 0.5;
      PathBezierQuadraticCurveToCasteljau(path,x1,y1,fVar1,fVar2,fVar3,y3_00,tess_tol,iVar6);
      fVar1 = x3 - fVar3;
      fVar2 = y3 - y3_00;
      fVar4 = (x2 - x3) * fVar2 - fVar1 * (y2 - y3);
      iVar6 = iVar6 + 1;
      x1 = fVar3;
      y1 = y3_00;
    } while ((fVar1 * fVar1 + fVar2 * fVar2) * tess_tol <= fVar4 * fVar4 * 4.0);
  }
  iVar7 = path->Size;
  if (iVar7 == path->Capacity) {
    if (iVar7 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar7 / 2 + iVar7;
    }
    iVar5 = iVar7 + 1;
    if (iVar7 + 1 < iVar6) {
      iVar5 = iVar6;
    }
    __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar5 << 3);
    if (path->Data != (ImVec2 *)0x0) {
      memcpy(__dest,path->Data,(long)path->Size << 3);
      ImGui::MemFree(path->Data);
    }
    path->Data = __dest;
    path->Capacity = iVar5;
    iVar7 = path->Size;
  }
  else {
    __dest = path->Data;
  }
  __dest[iVar7].x = x3;
  __dest[iVar7].y = y3;
  path->Size = path->Size + 1;
  return;
}

Assistant:

static void PathBezierQuadraticCurveToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float tess_tol, int level)
{
    float dx = x3 - x1, dy = y3 - y1;
    float det = (x2 - x3) * dy - (y2 - y3) * dx;
    if (det * det * 4.0f < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x3, y3));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2) * 0.5f, y12 = (y1 + y2) * 0.5f;
        float x23 = (x2 + x3) * 0.5f, y23 = (y2 + y3) * 0.5f;
        float x123 = (x12 + x23) * 0.5f, y123 = (y12 + y23) * 0.5f;
        PathBezierQuadraticCurveToCasteljau(path, x1, y1, x12, y12, x123, y123, tess_tol, level + 1);
        PathBezierQuadraticCurveToCasteljau(path, x123, y123, x23, y23, x3, y3, tess_tol, level + 1);
    }
}